

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.h
# Opt level: O2

void __thiscall tt::detail::FixedBuffer<4000>::append(FixedBuffer<4000> *this,char *buf,size_t len)

{
  char **ppcVar1;
  
  ppcVar1 = &this->m_cur;
  if ((int)len < (int)ppcVar1 - (int)this->m_cur) {
    memcpy(this->m_cur,buf,len);
    *ppcVar1 = *ppcVar1 + len;
  }
  return;
}

Assistant:

void append(const char* buf, size_t len){
		if(avail() > static_cast<int>(len)){   //如果当前空间足够就将数据复制进去， 这里有待实现， 如果空间不够的情况
			memcpy(m_cur,buf,len);
			m_cur += len;
		}
	}